

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

void AccumulateRGB(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,int rgb_stride,
                  uint16_t *dst,int width)

{
  int iVar1;
  uint16_t *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = 0;
  uVar5 = (ulong)(uint)(width >> 1);
  if (width >> 1 < 1) {
    uVar5 = uVar3;
  }
  lVar4 = (long)(rgb_stride + step);
  puVar2 = dst + 2;
  while (iVar1 = (int)uVar5, uVar5 = (ulong)(iVar1 - 1), iVar1 != 0) {
    iVar1 = LinearToGamma((uint)kGammaToLinearTab[r_ptr[uVar3 + lVar4]] +
                          (uint)kGammaToLinearTab[r_ptr[uVar3 + (long)rgb_stride]] +
                          (uint)kGammaToLinearTab[r_ptr[uVar3 + (uint)step]] +
                          (uint)kGammaToLinearTab[r_ptr[uVar3]],0);
    puVar2[-2] = (uint16_t)iVar1;
    iVar1 = LinearToGamma((uint)kGammaToLinearTab[g_ptr[uVar3 + lVar4]] +
                          (uint)kGammaToLinearTab[g_ptr[uVar3 + (long)rgb_stride]] +
                          (uint)kGammaToLinearTab[g_ptr[uVar3 + (uint)step]] +
                          (uint)kGammaToLinearTab[g_ptr[uVar3]],0);
    puVar2[-1] = (uint16_t)iVar1;
    iVar1 = LinearToGamma((uint)kGammaToLinearTab[b_ptr[uVar3 + lVar4]] +
                          (uint)kGammaToLinearTab[b_ptr[uVar3 + (long)rgb_stride]] +
                          (uint)kGammaToLinearTab[b_ptr[uVar3 + (uint)step]] +
                          (uint)kGammaToLinearTab[b_ptr[uVar3]],0);
    *puVar2 = (uint16_t)iVar1;
    uVar3 = uVar3 + (uint)(step * 2);
    puVar2 = puVar2 + 4;
  }
  if ((width & 1U) != 0) {
    uVar3 = uVar3 & 0xffffffff;
    iVar1 = LinearToGamma((uint)kGammaToLinearTab[r_ptr[(long)rgb_stride + uVar3]] +
                          (uint)kGammaToLinearTab[r_ptr[uVar3]],1);
    puVar2[-2] = (uint16_t)iVar1;
    iVar1 = LinearToGamma((uint)kGammaToLinearTab[g_ptr[(long)rgb_stride + uVar3]] +
                          (uint)kGammaToLinearTab[g_ptr[uVar3]],1);
    puVar2[-1] = (uint16_t)iVar1;
    iVar1 = LinearToGamma((uint)kGammaToLinearTab[b_ptr[(long)rgb_stride + uVar3]] +
                          (uint)kGammaToLinearTab[b_ptr[uVar3]],1);
    *puVar2 = (uint16_t)iVar1;
  }
  return;
}

Assistant:

static WEBP_INLINE void AccumulateRGB(const uint8_t* const r_ptr,
                                      const uint8_t* const g_ptr,
                                      const uint8_t* const b_ptr,
                                      int step, int rgb_stride,
                                      uint16_t* dst, int width) {
  int i, j;
  for (i = 0, j = 0; i < (width >> 1); i += 1, j += 2 * step, dst += 4) {
    dst[0] = SUM4(r_ptr + j, step);
    dst[1] = SUM4(g_ptr + j, step);
    dst[2] = SUM4(b_ptr + j, step);
    // MemorySanitizer may raise false positives with data that passes through
    // RGBA32PackedToPlanar_16b_SSE41() due to incorrect modeling of shuffles.
    // See https://crbug.com/webp/573.
#ifdef WEBP_MSAN
    dst[3] = 0;
#endif
  }
  if (width & 1) {
    dst[0] = SUM2(r_ptr + j);
    dst[1] = SUM2(g_ptr + j);
    dst[2] = SUM2(b_ptr + j);
#ifdef WEBP_MSAN
    dst[3] = 0;
#endif
  }
}